

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::GrowCapacity
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  ushort uVar1;
  Arena *this_00;
  KeyValue *__src;
  ushort uVar2;
  KeyValue *pKVar3;
  const_iterator __position;
  ulong n;
  bool bVar4;
  _Alloc_node local_58;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_50;
  
  uVar2 = this->flat_capacity_;
  if (uVar2 < minimum_new_capacity && uVar2 < 0x101) {
    do {
      bVar4 = uVar2 == 0;
      uVar2 = uVar2 * 4;
      if (bVar4) {
        uVar2 = 1;
      }
    } while (uVar2 < minimum_new_capacity);
    this->flat_capacity_ = uVar2;
    this_00 = this->arena_;
    __src = (this->map_).flat;
    uVar1 = this->flat_size_;
    if (uVar2 < 0x101) {
      n = (ulong)uVar2 << 5;
      if (this_00 == (Arena *)0x0) {
        pKVar3 = (KeyValue *)operator_new__(n);
      }
      else {
        if (this_00->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(this_00,(type_info *)&KeyValue::typeinfo,n);
        }
        pKVar3 = (KeyValue *)ArenaImpl::AllocateAligned(&this_00->impl_,n);
      }
      (this->map_).flat = pKVar3;
      if (uVar1 != 0) {
        memmove(pKVar3,__src,(ulong)uVar1 << 5);
      }
    }
    else {
      if (this_00 == (Arena *)0x0) {
        pKVar3 = (KeyValue *)operator_new(0x30);
        (pKVar3->second).type = '\0';
        (pKVar3->second).is_repeated = false;
        (pKVar3->second).field_0xa = 0;
        (pKVar3->second).is_packed = false;
        (pKVar3->second).cached_size = 0;
        (pKVar3->second).descriptor = (FieldDescriptor *)0x0;
        *(undefined8 *)pKVar3 = 0;
        (pKVar3->second).field_0.int64_value = 0;
      }
      else {
        if (this_00->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation
                    (this_00,(type_info *)
                             &std::
                              map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                              ::typeinfo,0x30);
        }
        pKVar3 = (KeyValue *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (&this_00->impl_,0x30,
                            arena_destruct_object<std::map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>>
                           );
        *(undefined8 *)pKVar3 = 0;
        (pKVar3->second).field_0.int64_value = 0;
        (pKVar3->second).type = '\0';
        (pKVar3->second).is_repeated = false;
        (pKVar3->second).field_0xa = 0;
        (pKVar3->second).is_packed = false;
        (pKVar3->second).cached_size = 0;
      }
      (pKVar3->second).descriptor = (FieldDescriptor *)&pKVar3->second;
      *(Extension **)(pKVar3 + 1) = &pKVar3->second;
      pKVar3[1].second.field_0.int64_value = 0;
      (this->map_).flat = pKVar3;
      if (uVar1 != 0) {
        __position._M_node = (_Base_ptr)(pKVar3->second).descriptor;
        pKVar3 = __src;
        do {
          local_58._M_t =
               (_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                *)(this->map_).flat;
          local_50.first = pKVar3->first;
          local_50.second.descriptor = (pKVar3->second).descriptor;
          local_50.second.field_0 = (pKVar3->second).field_0;
          local_50.second.type = (pKVar3->second).type;
          local_50.second.is_repeated = (pKVar3->second).is_repeated;
          local_50.second._10_1_ = (pKVar3->second).field_0xa;
          local_50.second.is_packed = (pKVar3->second).is_packed;
          local_50.second.cached_size = (pKVar3->second).cached_size;
          __position._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
               ::
               _M_insert_unique_<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>::_Alloc_node>
                         ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                           *)local_58._M_t,__position,&local_50,&local_58);
          pKVar3 = pKVar3 + 1;
        } while (pKVar3 != __src + uVar1);
      }
      this->flat_size_ = 0;
    }
    if (__src != (KeyValue *)0x0 && this->arena_ == (Arena *)0x0) {
      operator_delete__(__src);
    }
  }
  return;
}

Assistant:

bool is_large() const { return flat_capacity_ > kMaximumFlatCapacity; }